

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseRefType(WastParser *this,Type *out_type)

{
  TokenType TVar1;
  Result RVar2;
  char *format;
  long lVar3;
  Type type;
  Token token;
  anon_union_24_4_98baf137_for_Token_2 local_b8;
  undefined1 local_a0 [32];
  size_type *local_80;
  anon_union_24_4_98baf137_for_Token_2 local_78;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    Consume((Token *)local_a0,this);
    if ((TokenType)local_80 != First_Type) {
      __assert_fail("HasType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x60,"Type wabt::Token::type() const");
    }
    local_b8.literal_.type = local_78.literal_.type;
    if ((local_78.literal_.type == 0xffffffef) &&
       ((this->options_->features).reference_types_enabled_ == false)) {
      format = Type::GetName(&local_b8.type_);
      Error(this,0x19a88e,format);
      RVar2.enum_ = Error;
    }
    else {
      out_type->enum_ = (Enum)local_78.type_.enum_;
      RVar2.enum_ = Ok;
    }
  }
  else {
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"funcref","");
    local_80 = &local_78.text_.size_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"anyref","");
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"nullref","");
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"exnref","");
    local_b8.text_.data_ = (char *)0x0;
    local_b8.text_.size_ = 0;
    local_b8.literal_.text.size_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               (string *)local_a0,&stack0xffffffffffffffe0);
    lVar3 = 0;
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_b8.text_,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8.text_);
    do {
      if (local_30 + lVar3 != *(undefined1 **)((long)local_40 + lVar3)) {
        operator_delete(*(undefined1 **)((long)local_40 + lVar3));
      }
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x80);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseRefType(Type* out_type) {
  WABT_TRACE(ParseRefType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"funcref", "anyref", "nullref", "exnref"});
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::Anyref && !options_->features.reference_types_enabled()) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}